

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrNSImpl.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DOMAttrNSImpl::setPrefix(DOMAttrNSImpl *this,XMLCh *prefix)

{
  short *psVar1;
  short *psVar2;
  XMLCh XVar3;
  DOMDocument *pDVar4;
  int iVar5;
  XMLCh *pXVar6;
  XMLCh *pXVar7;
  XMLCh *pXVar8;
  XMLCh *pXVar9;
  undefined4 extraout_var;
  ulong uVar10;
  DOMStringPoolEntry *pDVar11;
  undefined4 extraout_var_01;
  ulong uVar12;
  long lVar13;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  DOMException *this_00;
  undefined4 extraout_var_08;
  undefined8 *puVar14;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  XMLCh *pXVar15;
  XMLCh *pXVar16;
  DOMStringPoolEntry *pDVar17;
  XMLCh XVar18;
  XMLSize_t XVar19;
  long lVar20;
  DOMDocumentImpl *this_01;
  bool bVar21;
  XMLCh temp [256];
  XMLCh local_238 [260];
  undefined4 extraout_var_00;
  
  pXVar6 = DOMNodeImpl::getXmlnsString();
  if (((this->super_DOMAttrImpl).fNode.flags & 1) != 0) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    iVar5 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
    if (CONCAT44(extraout_var_05,iVar5) == 0) {
      puVar14 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar5 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
      puVar14 = (undefined8 *)(CONCAT44(extraout_var_09,iVar5) + 0x158);
    }
    DOMException::DOMException(this_00,7,0,(MemoryManager *)*puVar14);
    goto LAB_002654ac;
  }
  if (((this->fNamespaceURI == (XMLCh *)0x0) || (*this->fNamespaceURI == L'\0')) ||
     (pXVar9 = this->fLocalName, pXVar9 == pXVar6)) {
LAB_00265369:
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    iVar5 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
    if (CONCAT44(extraout_var_03,iVar5) == 0) {
      puVar14 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar5 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
      puVar14 = (undefined8 *)(CONCAT44(extraout_var_06,iVar5) + 0x158);
    }
    DOMException::DOMException(this_00,0xe,0,(MemoryManager *)*puVar14);
    goto LAB_002654ac;
  }
  pXVar7 = pXVar6;
  pXVar8 = pXVar9;
  if (pXVar6 == (XMLCh *)0x0 || pXVar9 == (XMLCh *)0x0) {
    if (pXVar9 == (XMLCh *)0x0) {
      if (pXVar6 == (XMLCh *)0x0) goto LAB_00265369;
LAB_00264ee7:
      bVar21 = *pXVar7 == L'\0';
    }
    else {
      bVar21 = *pXVar9 == L'\0';
      if (bVar21 && pXVar6 != (XMLCh *)0x0) goto LAB_00264ee7;
    }
    if (bVar21) goto LAB_00265369;
  }
  else {
    do {
      XVar18 = *pXVar8;
      if (XVar18 == L'\0') goto LAB_00264ee7;
      XVar3 = *pXVar7;
      pXVar7 = pXVar7 + 1;
      pXVar8 = pXVar8 + 1;
    } while (XVar18 == XVar3);
  }
  if ((prefix == (XMLCh *)0x0) || (*prefix == L'\0')) {
    (this->super_DOMAttrImpl).fName = pXVar9;
    this->fPrefix = (XMLCh *)0x0;
    return;
  }
  pDVar4 = (this->super_DOMAttrImpl).fParent.fOwnerDocument;
  this_01 = (DOMDocumentImpl *)&pDVar4[-1].super_DOMNode;
  if (pDVar4 == (DOMDocument *)0x0) {
    this_01 = (DOMDocumentImpl *)0x0;
  }
  bVar21 = DOMDocumentImpl::isXMLName(this_01,prefix);
  if (!bVar21) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    iVar5 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
    if (CONCAT44(extraout_var_07,iVar5) == 0) {
      puVar14 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar5 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
      puVar14 = (undefined8 *)(CONCAT44(extraout_var_10,iVar5) + 0x158);
    }
    DOMException::DOMException(this_00,5,0,(MemoryManager *)*puVar14);
    goto LAB_002654ac;
  }
  pXVar7 = DOMNodeImpl::getXmlString();
  pXVar8 = DOMNodeImpl::getXmlURIString();
  pXVar9 = DOMNodeImpl::getXmlnsURIString();
  if (pXVar7 == prefix) {
LAB_00264f83:
    pXVar7 = this->fNamespaceURI;
    if (pXVar7 == pXVar8) goto LAB_00264ff0;
    if (pXVar8 == (XMLCh *)0x0 || pXVar7 == (XMLCh *)0x0) {
      if (pXVar7 == (XMLCh *)0x0) {
        if (pXVar8 == (XMLCh *)0x0) goto LAB_00264ff0;
LAB_00264fdf:
        bVar21 = *pXVar8 == L'\0';
      }
      else {
        bVar21 = *pXVar7 == L'\0';
        if (bVar21 && pXVar8 != (XMLCh *)0x0) goto LAB_00264fdf;
      }
      if (bVar21) goto LAB_00264ff0;
    }
    else {
      do {
        XVar18 = *pXVar7;
        if (XVar18 == L'\0') goto LAB_00264fdf;
        pXVar7 = pXVar7 + 1;
        XVar3 = *pXVar8;
        pXVar8 = pXVar8 + 1;
      } while (XVar18 == XVar3);
    }
LAB_00265081:
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    iVar5 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
    if (CONCAT44(extraout_var,iVar5) == 0) {
      puVar14 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar5 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
      puVar14 = (undefined8 *)(CONCAT44(extraout_var_04,iVar5) + 0x158);
    }
    DOMException::DOMException(this_00,0xe,0,(MemoryManager *)*puVar14);
  }
  else {
    pXVar15 = prefix;
    pXVar16 = prefix;
    if (pXVar7 == (XMLCh *)0x0) {
LAB_00264f7d:
      if (*pXVar15 == L'\0') goto LAB_00264f83;
    }
    else {
      do {
        XVar18 = *pXVar16;
        pXVar15 = pXVar7;
        if (XVar18 == L'\0') goto LAB_00264f7d;
        XVar3 = *pXVar7;
        pXVar7 = pXVar7 + 1;
        pXVar16 = pXVar16 + 1;
      } while (XVar18 == XVar3);
    }
LAB_00264ff0:
    if (pXVar6 == prefix) {
LAB_0026502d:
      pXVar6 = this->fNamespaceURI;
      if (pXVar6 != pXVar9) {
        if (pXVar9 != (XMLCh *)0x0 && pXVar6 != (XMLCh *)0x0) {
          do {
            XVar18 = *pXVar6;
            if (XVar18 == L'\0') goto LAB_002650b1;
            pXVar6 = pXVar6 + 1;
            XVar3 = *pXVar9;
            pXVar9 = pXVar9 + 1;
          } while (XVar18 == XVar3);
          goto LAB_00265081;
        }
        if (pXVar6 == (XMLCh *)0x0) {
          if (pXVar9 == (XMLCh *)0x0) goto LAB_002650bc;
LAB_002650b1:
          bVar21 = *pXVar9 == L'\0';
        }
        else {
          bVar21 = *pXVar6 == L'\0';
          if (bVar21 && pXVar9 != (XMLCh *)0x0) goto LAB_002650b1;
        }
        if (!bVar21) goto LAB_00265081;
      }
    }
    else {
      pXVar7 = prefix;
      pXVar8 = prefix;
      if (pXVar6 == (XMLCh *)0x0) {
LAB_00265023:
        if (*pXVar7 == L'\0') goto LAB_0026502d;
      }
      else {
        do {
          pXVar7 = pXVar6;
          XVar18 = *pXVar8;
          if (XVar18 == L'\0') goto LAB_00265023;
          pXVar8 = pXVar8 + 1;
          pXVar6 = pXVar7 + 1;
        } while (XVar18 == *pXVar7);
      }
    }
LAB_002650bc:
    iVar5 = XMLString::indexOf(prefix,L':');
    if (iVar5 == -1) {
      lVar13 = 0;
      do {
        psVar1 = (short *)((long)prefix + lVar13);
        lVar13 = lVar13 + 2;
      } while (*psVar1 != 0);
      uVar10 = (ulong)(ushort)*prefix;
      if (uVar10 == 0) {
        uVar10 = 0;
      }
      else {
        XVar18 = prefix[1];
        if (XVar18 != L'\0') {
          pXVar6 = prefix + 2;
          do {
            uVar10 = (ulong)(ushort)XVar18 + (uVar10 >> 0x18) + uVar10 * 0x26;
            XVar18 = *pXVar6;
            pXVar6 = pXVar6 + 1;
          } while (XVar18 != L'\0');
        }
        uVar10 = uVar10 % this_01->fNameTableSize;
      }
      XVar19 = (lVar13 >> 1) - 1;
      pDVar11 = this_01->fNameTable[uVar10];
      if (pDVar11 == (DOMStringPoolEntry *)0x0) {
        pDVar17 = (DOMStringPoolEntry *)(this_01->fNameTable + uVar10);
      }
      else {
        do {
          pDVar17 = pDVar11;
          if (pDVar17->fLength == XVar19) {
            pXVar6 = pDVar17->fString;
            if (pXVar6 == prefix) goto LAB_002651ba;
            lVar13 = 0;
            do {
              psVar1 = (short *)((long)pXVar6 + lVar13);
              if (*psVar1 == 0) {
                if (*(short *)((long)prefix + lVar13) == 0) goto LAB_002651ba;
                break;
              }
              psVar2 = (short *)((long)prefix + lVar13);
              lVar13 = lVar13 + 2;
            } while (*psVar1 == *psVar2);
          }
          pDVar11 = pDVar17->fNext;
        } while (pDVar17->fNext != (DOMStringPoolEntry *)0x0);
      }
      iVar5 = (*(this_01->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                        (this_01,XVar19 * 2 + 0x18);
      pDVar11 = (DOMStringPoolEntry *)CONCAT44(extraout_var_00,iVar5);
      pDVar17->fNext = pDVar11;
      pDVar11->fLength = XVar19;
      pDVar11->fNext = (DOMStringPoolEntry *)0x0;
      pXVar6 = pDVar11->fString;
      XMLString::copyString(pXVar6,prefix);
LAB_002651ba:
      this->fPrefix = pXVar6;
      lVar13 = 0;
      do {
        psVar1 = (short *)((long)prefix + lVar13);
        lVar13 = lVar13 + 2;
      } while (*psVar1 != 0);
      lVar20 = 0;
      if (this->fLocalName != (XMLCh *)0x0) {
        do {
          psVar1 = (short *)((long)this->fLocalName + lVar20);
          lVar20 = lVar20 + 2;
        } while (*psVar1 != 0);
        lVar20 = (lVar20 >> 1) + -1;
      }
      uVar10 = lVar20 + (lVar13 >> 1);
      if (uVar10 < 0xff) {
        pXVar6 = local_238;
      }
      else {
        iVar5 = (*this_01->fMemoryManager->_vptr_MemoryManager[3])
                          (this_01->fMemoryManager,uVar10 * 2);
        pXVar6 = (XMLCh *)CONCAT44(extraout_var_01,iVar5);
      }
      XMLString::copyString(pXVar6,prefix);
      (pXVar6 + (lVar13 >> 1))[-1] = L':';
      XMLString::copyString(pXVar6 + (lVar13 >> 1),this->fLocalName);
      if (pXVar6 == (XMLCh *)0x0) {
        pXVar9 = (XMLCh *)0x0;
      }
      else {
        lVar13 = 0;
        do {
          psVar1 = (short *)((long)pXVar6 + lVar13);
          lVar13 = lVar13 + 2;
        } while (*psVar1 != 0);
        uVar12 = (ulong)(ushort)*pXVar6;
        if (uVar12 == 0) {
          uVar12 = 0;
        }
        else {
          XVar18 = pXVar6[1];
          if (XVar18 != L'\0') {
            pXVar9 = pXVar6 + 2;
            do {
              uVar12 = (ulong)(ushort)XVar18 + (uVar12 >> 0x18) + uVar12 * 0x26;
              XVar18 = *pXVar9;
              pXVar9 = pXVar9 + 1;
            } while (XVar18 != L'\0');
          }
          uVar12 = uVar12 % this_01->fNameTableSize;
        }
        XVar19 = (lVar13 >> 1) - 1;
        pDVar11 = this_01->fNameTable[uVar12];
        if (pDVar11 == (DOMStringPoolEntry *)0x0) {
          pDVar17 = (DOMStringPoolEntry *)(this_01->fNameTable + uVar12);
        }
        else {
          do {
            pDVar17 = pDVar11;
            if (pDVar17->fLength == XVar19) {
              pXVar9 = pDVar17->fString;
              if (pXVar9 == pXVar6) goto LAB_00265335;
              lVar13 = 0;
              do {
                psVar1 = (short *)((long)pXVar9 + lVar13);
                if (*psVar1 == 0) {
                  if (*(short *)((long)pXVar6 + lVar13) == 0) goto LAB_00265335;
                  break;
                }
                psVar2 = (short *)((long)pXVar6 + lVar13);
                lVar13 = lVar13 + 2;
              } while (*psVar1 == *psVar2);
            }
            pDVar11 = pDVar17->fNext;
          } while (pDVar17->fNext != (DOMStringPoolEntry *)0x0);
        }
        iVar5 = (*(this_01->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                          (this_01,XVar19 * 2 + 0x18);
        pDVar11 = (DOMStringPoolEntry *)CONCAT44(extraout_var_02,iVar5);
        pDVar17->fNext = pDVar11;
        pDVar11->fLength = XVar19;
        pDVar11->fNext = (DOMStringPoolEntry *)0x0;
        pXVar9 = pDVar11->fString;
        XMLString::copyString(pXVar9,pXVar6);
      }
LAB_00265335:
      (this->super_DOMAttrImpl).fName = pXVar9;
      if (0xfe < uVar10) {
        (*this_01->fMemoryManager->_vptr_MemoryManager[4])(this_01->fMemoryManager,pXVar6);
      }
      return;
    }
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    iVar5 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
    if (CONCAT44(extraout_var_08,iVar5) == 0) {
      puVar14 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar5 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
      puVar14 = (undefined8 *)(CONCAT44(extraout_var_11,iVar5) + 0x158);
    }
    DOMException::DOMException(this_00,0xe,0,(MemoryManager *)*puVar14);
  }
LAB_002654ac:
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMAttrNSImpl::setPrefix(const XMLCh *prefix)
{
    const XMLCh * xmlns = DOMNodeImpl::getXmlnsString();

    if (fNode.isReadOnly())
        throw DOMException(DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNodeMemoryManager);
    if (fNamespaceURI == 0 || fNamespaceURI[0] == chNull || XMLString::equals(fLocalName, xmlns))
        throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);

    if (prefix == 0 || prefix[0] == chNull) {
        fName = fLocalName;
        fPrefix = 0;
        return;
    }

    DOMDocumentImpl* doc = (DOMDocumentImpl*) fParent.fOwnerDocument;

    if (!doc->isXMLName(prefix))
        throw DOMException(DOMException::INVALID_CHARACTER_ERR,0, GetDOMNodeMemoryManager);

    const XMLCh * xml = DOMNodeImpl::getXmlString();
    const XMLCh * xmlURI = DOMNodeImpl::getXmlURIString();
    const XMLCh * xmlnsURI = DOMNodeImpl::getXmlnsURIString();

    if ((XMLString::equals(prefix, xml) &&
         !XMLString::equals(fNamespaceURI, xmlURI))
        || (XMLString::equals(prefix, xmlns) &&
            !XMLString::equals(fNamespaceURI, xmlnsURI)))
        throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);

    if (XMLString::indexOf(prefix, chColon) != -1) {
        throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);
    }

    this-> fPrefix = doc->getPooledString(prefix);

    XMLSize_t prefixLen = XMLString::stringLen(prefix);
    XMLSize_t newQualifiedNameLen = prefixLen+1+XMLString::stringLen(fLocalName);
    XMLCh* newName;
    XMLCh temp[256];
    if (newQualifiedNameLen >= 255)
        newName = (XMLCh*) doc->getMemoryManager()->allocate
        (
            newQualifiedNameLen * sizeof(XMLCh)
        );//new XMLCh[newQualifiedNameLen];
    else
        newName = temp;

    // newName = prefix + chColon + fLocalName;
    XMLString::copyString(newName, prefix);
    newName[prefixLen] = chColon;
    XMLString::copyString(&newName[prefixLen+1], fLocalName);

    fName = doc->getPooledString(newName);

    if (newQualifiedNameLen >= 255)
      doc->getMemoryManager()->deallocate(newName);//delete[] newName;

}